

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O0

void Sdb_StoMergeCuts(Sdb_Sto_t *p,int iObj)

{
  int nCutNum_00;
  int fIsXor_00;
  int fCompl0;
  int fCompl1;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pObj_00;
  Sdb_Cut_t **ppCuts;
  word wVar6;
  Sdb_Cut_t **pCutsR;
  Sdb_Cut_t *pCut1;
  Sdb_Cut_t *pCut0;
  int nCutsR;
  int k;
  int i;
  int nCuts1;
  int nCuts0;
  int Fan1;
  int Fan0;
  int fComp1;
  int fComp0;
  int nCutNum;
  int nCutSize;
  int fIsXor;
  Gia_Obj_t *pObj;
  int iObj_local;
  Sdb_Sto_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pGia,iObj);
  fIsXor_00 = Gia_ObjIsXor(pObj_00);
  iVar5 = p->nCutSize;
  nCutNum_00 = p->nCutNum;
  fCompl0 = Gia_ObjFaninC0(pObj_00);
  fCompl1 = Gia_ObjFaninC1(pObj_00);
  iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
  iVar2 = Gia_ObjFaninId1(pObj_00,iObj);
  iVar1 = Sdb_StoPrepareSet(p,iVar1,0);
  iVar2 = Sdb_StoPrepareSet(p,iVar2,1);
  pCut0._0_4_ = 0;
  ppCuts = p->ppCuts;
  iVar3 = Gia_ObjIsBuf(pObj_00);
  if (iVar3 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x2e4,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  iVar3 = Gia_ObjIsMux(p->pGia,pObj_00);
  if (iVar3 == 0) {
    Sdb_StoInitResult(p);
    p->CutCount[0] = (double)(iVar1 * iVar2) + p->CutCount[0];
    pCut1 = p->pCuts[0];
    for (nCutsR = 0; nCutsR < iVar1; nCutsR = nCutsR + 1) {
      pCutsR = (Sdb_Cut_t **)(p->pCuts + 1);
      for (pCut0._4_4_ = 0; pCut0._4_4_ < iVar2; pCut0._4_4_ = pCut0._4_4_ + 1) {
        if (((int)((*(uint *)&pCut1->field_0x14 >> 0x1c) + (*(uint *)((long)pCutsR + 0x14) >> 0x1c))
             <= iVar5) || (iVar3 = Sdb_CutCountBits(pCut1->Sign | (ulong)*pCutsR), iVar3 <= iVar5))
        {
          p->CutCount[1] = p->CutCount[1] + 1.0;
          iVar3 = Sdb_CutMergeOrder(pCut1,(Sdb_Cut_t *)pCutsR,ppCuts[(int)pCut0],iVar5);
          if ((iVar3 != 0) && (iVar3 = Sdb_CutSetLastCutIsContained(ppCuts,(int)pCut0), iVar3 == 0))
          {
            p->CutCount[2] = p->CutCount[2] + 1.0;
            if ((p->fCutMin != 0) &&
               (iVar3 = Sdb_CutComputeTruth(p,pCut1,(Sdb_Cut_t *)pCutsR,fCompl0,fCompl1,
                                            ppCuts[(int)pCut0],fIsXor_00), iVar3 != 0)) {
              wVar6 = Sdb_CutGetSign(ppCuts[(int)pCut0]);
              ppCuts[(int)pCut0]->Sign = wVar6;
            }
            uVar4 = Sdb_CutTreeLeaves(p,ppCuts[(int)pCut0]);
            *(uint *)&ppCuts[(int)pCut0]->field_0x14 =
                 *(uint *)&ppCuts[(int)pCut0]->field_0x14 & 0xf0000000 | uVar4 & 0xfffffff;
            pCut0._0_4_ = Sdb_CutSetAddCut(ppCuts,(int)pCut0,nCutNum_00);
          }
        }
        pCutsR = pCutsR + 6;
      }
      pCut1 = pCut1 + 1;
    }
    p->CutCount[3] = (double)(int)pCut0 + p->CutCount[3];
    p->nCutsOver = (uint)((int)pCut0 == nCutNum_00 + -1) + p->nCutsOver;
    p->nCutsR = (int)pCut0;
    p->Pivot = iObj;
    if ((0 < (int)pCut0) && ((int)pCut0 < nCutNum_00)) {
      iVar5 = Sdb_CutSetCheckArray(ppCuts,(int)pCut0);
      if (iVar5 == 0) {
        __assert_fail("Sdb_CutSetCheckArray(pCutsR, nCutsR)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                      ,0x306,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
      }
      Sdb_StoStoreResult(p,iObj,ppCuts,(int)pCut0);
      if ((1 < (int)pCut0) || (1 < *(uint *)&(*ppCuts)->field_0x14 >> 0x1c)) {
        Sdb_CutAddUnit(p,iObj);
      }
      return;
    }
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x305,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                ,0x2e5,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
}

Assistant:

void Sdb_StoMergeCuts( Sdb_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int fIsXor       = Gia_ObjIsXor(pObj);
    int nCutSize     = p->nCutSize;
    int nCutNum      = p->nCutNum;
    int fComp0       = Gia_ObjFaninC0(pObj);
    int fComp1       = Gia_ObjFaninC1(pObj);
    int Fan0         = Gia_ObjFaninId0(pObj, iObj);
    int Fan1         = Gia_ObjFaninId1(pObj, iObj);
    int nCuts0       = Sdb_StoPrepareSet( p, Fan0, 0 );
    int nCuts1       = Sdb_StoPrepareSet( p, Fan1, 1 );
    int i, k, nCutsR = 0;
    Sdb_Cut_t * pCut0, * pCut1, ** pCutsR = p->ppCuts;
    assert( !Gia_ObjIsBuf(pObj) );
    assert( !Gia_ObjIsMux(p->pGia, pObj) );
    Sdb_StoInitResult( p );
    p->CutCount[0] += nCuts0 * nCuts1;
    for ( i = 0, pCut0 = p->pCuts[0]; i < nCuts0; i++, pCut0++ )
    for ( k = 0, pCut1 = p->pCuts[1]; k < nCuts1; k++, pCut1++ )
    {
        if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nCutSize && Sdb_CutCountBits(pCut0->Sign | pCut1->Sign) > nCutSize )
            continue;
        p->CutCount[1]++; 
        if ( !Sdb_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nCutSize) )
            continue;
        if ( Sdb_CutSetLastCutIsContained(pCutsR, nCutsR) )
            continue;
        p->CutCount[2]++;
        if ( p->fCutMin && Sdb_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
            pCutsR[nCutsR]->Sign = Sdb_CutGetSign(pCutsR[nCutsR]);
        pCutsR[nCutsR]->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutsR[nCutsR] );
        nCutsR = Sdb_CutSetAddCut( pCutsR, nCutsR, nCutNum );
    }
    p->CutCount[3] += nCutsR;
    p->nCutsOver += nCutsR == nCutNum-1;
    p->nCutsR = nCutsR;
    p->Pivot = iObj;
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %4d  NumCuts = %4d\n", iObj, nCutsR );
        for ( i = 0; i < nCutsR; i++ )
            Sdb_CutPrint( p, iObj, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    assert( Sdb_CutSetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Sdb_StoStoreResult( p, iObj, pCutsR, nCutsR );
    if ( nCutsR > 1 || pCutsR[0]->nLeaves > 1 )
        Sdb_CutAddUnit( p, iObj );
}